

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererParallelTests::RowsAreProcessedInInterlacedOrderInDedicatedThreads
          (RendererParallelTests *this)

{
  int local_2dc;
  int local_2d8;
  allocator local_2d1;
  LocationInfo local_2d0;
  renderer_parallel r3;
  bitmap<unsigned_short,_0UL,_0UL> bitmap;
  string local_258;
  renderer_parallel r2;
  thread_mapping_blender<unsigned_short,_unsigned_char> blender;
  thread_mapping mapping;
  mask_full<8UL> mask;
  cell cells6 [2];
  undefined1 local_1a0 [8];
  cell cells5 [2];
  undefined1 local_180 [8];
  cell cells4 [2];
  undefined1 local_160 [8];
  cell cells3 [2];
  undefined1 local_140 [8];
  cell cells2 [2];
  undefined1 local_120 [8];
  cell cells1 [2];
  renderer_parallel r1;
  mutex mtx;
  scanline_cells cells [6];
  
  cells[0].second = (cell *)&r1;
  cells1[0].x = 0;
  cells1[0].area = 0;
  cells1[0].cover = 0x10;
  cells1[1].x = 3;
  cells1[1].area = 0;
  cells1[1].cover = -0x10;
  cells[1].second = (cell *)local_120;
  cells2[0].x = 1;
  cells2[0].area = 0;
  cells2[0].cover = 0x10;
  cells2[1].x = 4;
  cells2[1].area = 0;
  cells2[1].cover = -0x10;
  cells[2].second = (cell *)local_140;
  cells3[0].x = 2;
  cells3[0].area = 0;
  cells3[0].cover = 0x10;
  cells3[1].x = 5;
  cells3[1].area = 0;
  cells3[1].cover = -0x10;
  cells[3].second = (cell *)local_160;
  cells4[0].x = 1;
  cells4[0].area = 0;
  cells4[0].cover = 0x10;
  cells4[1].x = 4;
  cells4[1].area = 0;
  cells4[1].cover = -0x10;
  cells[4].second = (cell *)local_180;
  cells5[1].area = 0;
  cells5[1].cover = -0x10;
  cells5[0].x = 0;
  cells5[0].area = 0;
  cells5[0].cover = 0x10;
  cells5[1].x = 3;
  cells[5].second = (cell *)local_1a0;
  cells6[1].area = 0;
  cells6[1].cover = -0x10;
  cells6[0].x = 1;
  cells6[0].area = 0;
  cells6[0].cover = 0x10;
  cells6[1].x = 4;
  cells[0].first = cells1;
  cells[1].first = cells2;
  cells[2].first = cells3;
  cells[3].first = cells4;
  cells[4].first = cells5;
  cells[5].first = cells6;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,6>
            ((mask<8ul> *)&mask,&cells,0);
  mocks::bitmap<unsigned_short,_0UL,_0UL>::bitmap(&bitmap,5,6);
  mapping.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mapping.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mapping.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mutex::mutex(&mtx);
  blender._mapping = &mapping;
  blender._mtx = &mtx;
  renderer_parallel::renderer_parallel(&r1,2);
  renderer_parallel::operator()
            (&r1,&bitmap,(vector_i)0x0,(rect_i *)0x0,&mask,&blender,
             (simple_alpha<unsigned_char,_8UL> *)&r2);
  local_2d0.filename._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,0);
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,2);
  std::__cxx11::string::string
            ((string *)&r3,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2dc);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r2,(string *)&r3,0x97);
  ut::are_equal<int,int>((int *)&local_2d0,(int *)&local_258,(LocationInfo *)&r2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_2d0.filename._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,0);
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,4);
  std::__cxx11::string::string
            ((string *)&r3,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2dc);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r2,(string *)&r3,0x98);
  ut::are_equal<int,int>((int *)&local_2d0,(int *)&local_258,(LocationInfo *)&r2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_2d0.filename._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,0);
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,1);
  std::__cxx11::string::string
            ((string *)&r3,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2dc);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r2,(string *)&r3,0x9a);
  ut::are_not_equal<int,int>((int *)&local_2d0,(int *)&local_258,(LocationInfo *)&r2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_2d0.filename._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,1);
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,3);
  std::__cxx11::string::string
            ((string *)&r3,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2dc);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r2,(string *)&r3,0x9b);
  ut::are_equal<int,int>((int *)&local_2d0,(int *)&local_258,(LocationInfo *)&r2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_2d0.filename._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,1);
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,5);
  std::__cxx11::string::string
            ((string *)&r3,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2dc);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r2,(string *)&r3,0x9c);
  ut::are_equal<int,int>((int *)&local_2d0,(int *)&local_258,(LocationInfo *)&r2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  renderer_parallel::renderer_parallel(&r2,3);
  renderer_parallel::operator()
            (&r2,&bitmap,(vector_i)0x0,(rect_i *)0x0,&mask,&blender,
             (simple_alpha<unsigned_char,_8UL> *)&r3);
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,0);
  local_2dc = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,3);
  std::__cxx11::string::string
            ((string *)&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2d8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r3,&local_2d0.filename,0xa3);
  ut::are_equal<int,int>((int *)&local_258,&local_2dc,(LocationInfo *)&r3);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,0);
  local_2dc = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,1);
  std::__cxx11::string::string
            ((string *)&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2d8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r3,&local_2d0.filename,0xa5);
  ut::are_not_equal<int,int>((int *)&local_258,&local_2dc,(LocationInfo *)&r3);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,1);
  local_2dc = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,4);
  std::__cxx11::string::string
            ((string *)&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2d8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r3,&local_2d0.filename,0xa6);
  ut::are_equal<int,int>((int *)&local_258,&local_2dc,(LocationInfo *)&r3);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,0);
  local_2dc = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,2);
  std::__cxx11::string::string
            ((string *)&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2d8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r3,&local_2d0.filename,0xa8);
  ut::are_not_equal<int,int>((int *)&local_258,&local_2dc,(LocationInfo *)&r3);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,1);
  local_2dc = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,2);
  std::__cxx11::string::string
            ((string *)&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2d8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r3,&local_2d0.filename,0xa9);
  ut::are_not_equal<int,int>((int *)&local_258,&local_2dc,(LocationInfo *)&r3);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_258._M_dataplus._M_p._0_4_ =
       (anonymous_namespace)::
       get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                 (&bitmap,2);
  local_2dc = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,5);
  std::__cxx11::string::string
            ((string *)&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&local_2d8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&r3,&local_2d0.filename,0xaa);
  ut::are_equal<int,int>((int *)&local_258,&local_2dc,(LocationInfo *)&r3);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  renderer_parallel::renderer_parallel(&r3,5);
  renderer_parallel::operator()
            (&r3,&bitmap,(vector_i)0x0,(rect_i *)0x0,&mask,&blender,
             (simple_alpha<unsigned_char,_8UL> *)&local_2d0);
  local_2dc = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,0);
  local_2d8 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,5);
  std::__cxx11::string::string
            ((string *)&local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_2d1);
  ut::LocationInfo::LocationInfo(&local_2d0,&local_258,0xb1);
  ut::are_equal<int,int>(&local_2dc,&local_2d8,&local_2d0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_2dc = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,0);
  local_2d8 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        (&bitmap,1);
  std::__cxx11::string::string
            ((string *)&local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_2d1);
  ut::LocationInfo::LocationInfo(&local_2d0,&local_258,0xb2);
  ut::are_not_equal<int,int>(&local_2dc,&local_2d8,&local_2d0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  renderer_parallel::~renderer_parallel(&r3);
  renderer_parallel::~renderer_parallel(&r2);
  renderer_parallel::~renderer_parallel(&r1);
  mutex::~mutex(&mtx);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&mapping.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&bitmap);
  std::
  _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
  ::~_Vector_base(&mask.super_mask<8UL>._cells.
                   super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                 );
  return;
}

Assistant:

test( RowsAreProcessedInInterlacedOrderInDedicatedThreads )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x10 }, { 3, 0, -0x10 }, };
				const mocks::cell cells2[] = { { 1, 0, 0x10 }, { 4, 0, -0x10 }, };
				const mocks::cell cells3[] = { { 2, 0, 0x10 }, { 5, 0, -0x10 }, };
				const mocks::cell cells4[] = { { 1, 0, 0x10 }, { 4, 0, -0x10 }, };
				const mocks::cell cells5[] = { { 0, 0, 0x10 }, { 3, 0, -0x10 }, };
				const mocks::cell cells6[] = { { 1, 0, 0x10 }, { 4, 0, -0x10 }, };
				mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
					make_pair(begin(cells4), end(cells4)),
					make_pair(begin(cells5), end(cells5)),
					make_pair(begin(cells6), end(cells6)),
				};
				mocks::mask_full<8> mask(cells, 0);
				mocks::bitmap<uint16_t> bitmap(5, 6);
				thread_mapping mapping;
				mutex mtx;
				mocks::thread_mapping_blender<uint16_t, uint8_t> blender(mapping, mtx);

				// ACT
				renderer_parallel r1(2);
				r1(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 2));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 4));

				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 1));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 3));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 5));

				// ACT
				renderer_parallel r2(3);
				r2(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 3));

				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 1));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 4));

				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 2));
				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 2));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 2), get_scanline_thread<uint8_t>(bitmap, 5));

				// ACT
				renderer_parallel r3(5);
				r3(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 5));
				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 1));
			}